

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O2

bool __thiscall
helics::FederateState::messageShouldBeDelayed(FederateState *this,ActionMessage *cmd)

{
  int iVar1;
  pointer pGVar2;
  pointer pGVar3;
  long lVar4;
  __normal_iterator<const_helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
  _Var5;
  
  pGVar2 = (this->delayedFederates).
           super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pGVar3 = (this->delayedFederates).
           super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  lVar4 = (long)pGVar3 - (long)pGVar2 >> 2;
  if (lVar4 != 0) {
    if (lVar4 == 2) {
      iVar1 = (cmd->source_id).gid;
      if (iVar1 == pGVar2->gid) {
        return true;
      }
      return iVar1 == pGVar3[-1].gid;
    }
    if (lVar4 == 1) {
      return (cmd->source_id).gid == pGVar2->gid;
    }
    _Var5 = std::
            __lower_bound<__gnu_cxx::__normal_iterator<helics::GlobalFederateId_const*,std::vector<helics::GlobalFederateId,std::allocator<helics::GlobalFederateId>>>,helics::GlobalFederateId,__gnu_cxx::__ops::_Iter_less_val>
                      (pGVar2,pGVar3,&cmd->source_id);
    if (_Var5._M_current !=
        (this->delayedFederates).
        super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      return (_Var5._M_current)->gid == (cmd->source_id).gid;
    }
  }
  return false;
}

Assistant:

bool FederateState::messageShouldBeDelayed(const ActionMessage& cmd) const noexcept
{
    switch (delayedFederates.size()) {
        case 0:
            return false;
        case 1:
            return (cmd.source_id == delayedFederates.front());
        case 2:
            return ((cmd.source_id == delayedFederates.front()) ||
                    (cmd.source_id == delayedFederates.back()));
        default: {
            auto res =
                std::lower_bound(delayedFederates.begin(), delayedFederates.end(), cmd.source_id);
            return ((res != delayedFederates.end()) && (*res == cmd.source_id));
        }
    }
}